

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O0

void __thiscall
Assimp::COBImporter::ReadLght_Binary
          (COBImporter *this,Scene *out,StreamReaderLE *reader,ChunkInfo *nfo)

{
  undefined8 uVar1;
  undefined8 uVar2;
  Light *this_00;
  __shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2> *this_01;
  element_type *msh_00;
  Light *msh;
  shared_ptr<Assimp::COB::Light> local_60;
  shared_ptr<Assimp::COB::Node> local_50;
  undefined1 local_40 [8];
  chunk_guard cn;
  ChunkInfo *nfo_local;
  StreamReaderLE *reader_local;
  Scene *out_local;
  COBImporter *this_local;
  
  cn.cur = (long)nfo;
  if (nfo->version < 3) {
    chunk_guard::chunk_guard((chunk_guard *)local_40,nfo,reader);
    this_00 = (Light *)operator_new(0xf0);
    COB::Light::Light(this_00);
    std::shared_ptr<Assimp::COB::Light>::shared_ptr<Assimp::COB::Light,void>(&local_60,this_00);
    std::shared_ptr<Assimp::COB::Node>::shared_ptr<Assimp::COB::Light,void>(&local_50,&local_60);
    std::
    deque<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
    ::push_back(&out->nodes,&local_50);
    std::shared_ptr<Assimp::COB::Node>::~shared_ptr(&local_50);
    std::shared_ptr<Assimp::COB::Light>::~shared_ptr(&local_60);
    this_01 = &std::
               deque<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
               ::back(&out->nodes)->
               super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>;
    msh_00 = std::__shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>::get(this_01);
    uVar1 = *(undefined8 *)cn.cur;
    uVar2 = *(undefined8 *)(cn.cur + 8);
    (msh_00->super_ChunkInfo).id = (int)uVar1;
    (msh_00->super_ChunkInfo).parent_id = (int)((ulong)uVar1 >> 0x20);
    (msh_00->super_ChunkInfo).version = (int)uVar2;
    (msh_00->super_ChunkInfo).size = (int)((ulong)uVar2 >> 0x20);
    ReadBasicNodeInfo_Binary(this,msh_00,reader,(ChunkInfo *)cn.cur);
    chunk_guard::~chunk_guard((chunk_guard *)local_40);
  }
  else {
    UnsupportedChunk_Binary(this,reader,nfo,"Lght");
  }
  return;
}

Assistant:

void COBImporter::ReadLght_Binary(COB::Scene& out, StreamReaderLE& reader, const ChunkInfo& nfo)
{
    if(nfo.version > 2) {
        return UnsupportedChunk_Binary(reader,nfo,"Lght");
    }

    const chunk_guard cn(nfo,reader);

    out.nodes.push_back(std::shared_ptr<Light>(new Light()));
    Light& msh = (Light&)(*out.nodes.back().get());
    msh = nfo;

    ReadBasicNodeInfo_Binary(msh,reader,nfo);
}